

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# downloader.h
# Opt level: O0

void __thiscall Downloader::Find(Downloader *this,string *package,bool downloadonly)

{
  size_type *psVar1;
  bool bVar2;
  iterator iVar3;
  iterator iVar4;
  reference pbVar5;
  reference pvVar6;
  ostream *poVar7;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar8;
  string local_620;
  DownloadPackage local_600;
  pair<int,_DownloadPackage> *local_568;
  pair<int,_DownloadPackage> *local_560;
  pair<int,_DownloadPackage> local_558;
  int local_4bc;
  string local_4b8;
  DownloadPackage local_498;
  int local_404;
  undefined1 local_400 [4];
  int diff;
  undefined1 local_3e0 [8];
  DownloadPackage outpack;
  string cpackage;
  string local_328 [4];
  int slash;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> e;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  vector<std::pair<int,_DownloadPackage>,_std::allocator<std::pair<int,_DownloadPackage>_>_> pkglist
  ;
  bool match;
  allocator<char> local_2b9;
  value_type local_2b8;
  _Base_ptr local_298;
  undefined1 local_290;
  uchar local_282;
  uchar local_281;
  string local_280;
  undefined1 local_260 [8];
  string compiler;
  string compiler_original;
  key_type local_218;
  allocator<char> local_1f1;
  key_type local_1f0;
  allocator<char> local_1c9;
  key_type local_1c8;
  allocator<char> local_1a1;
  key_type local_1a0;
  allocator<char> local_179;
  key_type local_178;
  string local_158;
  undefined1 local_138 [8];
  DownloadPackage inpack;
  allocator<char> local_79;
  string local_78;
  string local_58;
  undefined1 local_38 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  list;
  bool downloadonly_local;
  string *package_local;
  Downloader *this_local;
  
  list.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = downloadonly;
  getUrl_abi_cxx11_(&local_58,this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"tir",&local_79);
  GetPackageList((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_38,this,&local_58,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  std::__cxx11::string::~string((string *)&local_58);
  iVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_38);
  iVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_38);
  std::
  sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::greater<std::__cxx11::string>>
            (iVar3._M_current,iVar4._M_current);
  std::__cxx11::string::string((string *)&local_158,(string *)package);
  LibParse((DownloadPackage *)local_138,this,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_178,"win64",&local_179);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::erase((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)((long)&inpack.version.field_2 + 8),&local_178);
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator(&local_179);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a0,"linux",&local_1a1);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::erase((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)((long)&inpack.version.field_2 + 8),&local_1a0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::allocator<char>::~allocator(&local_1a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"msvc",&local_1c9);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::erase((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)((long)&inpack.version.field_2 + 8),&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator(&local_1c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,"gnuc",&local_1f1);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::erase((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)((long)&inpack.version.field_2 + 8),&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::allocator<char>::~allocator(&local_1f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_218,"cling",
             (allocator<char> *)(compiler_original.field_2._M_local_buf + 0xf));
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::erase((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)((long)&inpack.version.field_2 + 8),&local_218);
  std::__cxx11::string::~string((string *)&local_218);
  std::allocator<char>::~allocator
            ((allocator<char> *)(compiler_original.field_2._M_local_buf + 0xf));
  get_compiler_abi_cxx11_((string *)((long)&compiler.field_2 + 8),this,true);
  std::__cxx11::string::string((string *)&local_280,(string *)(compiler.field_2._M_local_buf + 8));
  get_compiler_for_download((string *)local_260,this,&local_280);
  std::__cxx11::string::~string((string *)&local_280);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_260,"");
  if (bVar2) {
    local_281 = ispring::xout[0x34];
    poVar7 = operator<<((ostream *)&std::cout,ispring::xout[0x34]);
    poVar7 = std::operator<<(poVar7,"The specified compiler is not supported.");
    local_282 = ispring::xout[0x37];
    poVar7 = operator<<(poVar7,ispring::xout[0x37]);
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    exit(1);
  }
  pVar8 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)((long)&inpack.version.field_2 + 8),(value_type *)local_260);
  local_298 = (_Base_ptr)pVar8.first._M_node;
  local_290 = pVar8.second;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b8,"linux",&local_2b9);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&inpack.version.field_2 + 8),&local_2b8);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::allocator<char>::~allocator(&local_2b9);
  pkglist.
  super__Vector_base<std::pair<int,_DownloadPackage>,_std::allocator<std::pair<int,_DownloadPackage>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  std::vector<std::pair<int,_DownloadPackage>,_std::allocator<std::pair<int,_DownloadPackage>_>_>::
  vector((vector<std::pair<int,_DownloadPackage>,_std::allocator<std::pair<int,_DownloadPackage>_>_>
          *)&__range1);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_38);
  e.field_2._8_8_ =
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_38);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)((long)&e.field_2 + 8)), bVar2) {
    pbVar5 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1);
    std::__cxx11::string::string(local_328,(string *)pbVar5);
    std::__cxx11::string::find_last_of((char *)local_328,0x17d8eb);
    std::__cxx11::string::length();
    std::__cxx11::string::substr((ulong)((long)&outpack.url.field_2 + 8),(ulong)local_328);
    psVar1 = &outpack.url.field_2._M_allocated_capacity + 1;
    std::__cxx11::string::find_last_of((char)psVar1,0x2e);
    std::__cxx11::string::substr((ulong)local_400,(ulong)psVar1);
    CLibParse((DownloadPackage *)local_3e0,this,(string *)local_400);
    std::__cxx11::string::~string((string *)local_400);
    std::__cxx11::string::operator=
              ((string *)&outpack.options._M_t._M_impl.super__Rb_tree_header._M_node_count,local_328
              );
    local_404 = DownloadPackage::match((DownloadPackage *)local_138,(DownloadPackage *)local_3e0);
    if (local_404 == -1) {
      pkglist.
      super__Vector_base<std::pair<int,_DownloadPackage>,_std::allocator<std::pair<int,_DownloadPackage>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
      DownloadPackage::DownloadPackage(&local_498,(DownloadPackage *)local_3e0);
      std::__cxx11::string::string
                ((string *)&local_4b8,(string *)(compiler.field_2._M_local_buf + 8));
      Download(this,&local_498,&local_4b8,
               (bool)(list.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1));
      std::__cxx11::string::~string((string *)&local_4b8);
      DownloadPackage::~DownloadPackage(&local_498);
      local_4bc = 2;
    }
    else {
      if (local_404 != 0x7fffffff) {
        std::make_pair<int&,DownloadPackage&>(&local_558,&local_404,(DownloadPackage *)local_3e0);
        std::
        vector<std::pair<int,_DownloadPackage>,_std::allocator<std::pair<int,_DownloadPackage>_>_>::
        push_back((vector<std::pair<int,_DownloadPackage>,_std::allocator<std::pair<int,_DownloadPackage>_>_>
                   *)&__range1,&local_558);
        std::pair<int,_DownloadPackage>::~pair(&local_558);
      }
      local_4bc = 0;
    }
    DownloadPackage::~DownloadPackage((DownloadPackage *)local_3e0);
    std::__cxx11::string::~string((string *)(outpack.url.field_2._M_local_buf + 8));
    if (local_4bc == 0) {
      local_4bc = 0;
    }
    std::__cxx11::string::~string(local_328);
    if (local_4bc != 0) break;
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  if (((pkglist.
        super__Vector_base<std::pair<int,_DownloadPackage>,_std::allocator<std::pair<int,_DownloadPackage>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) &&
     (bVar2 = std::
              vector<std::pair<int,_DownloadPackage>,_std::allocator<std::pair<int,_DownloadPackage>_>_>
              ::empty((vector<std::pair<int,_DownloadPackage>,_std::allocator<std::pair<int,_DownloadPackage>_>_>
                       *)&__range1), !bVar2)) {
    local_560 = (pair<int,_DownloadPackage> *)
                std::
                vector<std::pair<int,_DownloadPackage>,_std::allocator<std::pair<int,_DownloadPackage>_>_>
                ::begin((vector<std::pair<int,_DownloadPackage>,_std::allocator<std::pair<int,_DownloadPackage>_>_>
                         *)&__range1);
    local_568 = (pair<int,_DownloadPackage> *)
                std::
                vector<std::pair<int,_DownloadPackage>,_std::allocator<std::pair<int,_DownloadPackage>_>_>
                ::end((vector<std::pair<int,_DownloadPackage>,_std::allocator<std::pair<int,_DownloadPackage>_>_>
                       *)&__range1);
    std::
    stable_sort<__gnu_cxx::__normal_iterator<std::pair<int,DownloadPackage>*,std::vector<std::pair<int,DownloadPackage>,std::allocator<std::pair<int,DownloadPackage>>>>,Downloader::Find(std::__cxx11::string,bool)::_lambda(std::pair<int,DownloadPackage>const&,std::pair<int,DownloadPackage>const&)_1_>
              (local_560,local_568);
    pkglist.
    super__Vector_base<std::pair<int,_DownloadPackage>,_std::allocator<std::pair<int,_DownloadPackage>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
    pvVar6 = std::
             vector<std::pair<int,_DownloadPackage>,_std::allocator<std::pair<int,_DownloadPackage>_>_>
             ::front((vector<std::pair<int,_DownloadPackage>,_std::allocator<std::pair<int,_DownloadPackage>_>_>
                      *)&__range1);
    DownloadPackage::DownloadPackage(&local_600,&pvVar6->second);
    std::__cxx11::string::string((string *)&local_620,(string *)(compiler.field_2._M_local_buf + 8))
    ;
    Download(this,&local_600,&local_620,
             (bool)(list.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1));
    std::__cxx11::string::~string((string *)&local_620);
    DownloadPackage::~DownloadPackage(&local_600);
  }
  if ((pkglist.
       super__Vector_base<std::pair<int,_DownloadPackage>,_std::allocator<std::pair<int,_DownloadPackage>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
    poVar7 = operator<<((ostream *)&std::cout,ispring::xout[0x34]);
    poVar7 = std::operator<<(poVar7,
                             "ERROR: Could not find a version that satisfies the requirement ");
    poVar7 = std::operator<<(poVar7,(string *)local_138);
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    poVar7 = std::operator<<((ostream *)&std::cout,"ERROR: No matching distribution found for ");
    std::operator<<(poVar7,(string *)local_138);
    bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&inpack.libname.field_2 + 8),"");
    if (bVar2) {
      poVar7 = std::operator<<((ostream *)&std::cout,"==");
      std::operator<<(poVar7,(string *)(inpack.libname.field_2._M_local_buf + 8));
    }
    poVar7 = operator<<((ostream *)&std::cout,ispring::xout[0x37]);
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  }
  std::vector<std::pair<int,_DownloadPackage>,_std::allocator<std::pair<int,_DownloadPackage>_>_>::
  ~vector((vector<std::pair<int,_DownloadPackage>,_std::allocator<std::pair<int,_DownloadPackage>_>_>
           *)&__range1);
  std::__cxx11::string::~string((string *)local_260);
  std::__cxx11::string::~string((string *)(compiler.field_2._M_local_buf + 8));
  DownloadPackage::~DownloadPackage((DownloadPackage *)local_138);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_38);
  return;
}

Assistant:

void Find(std::string package,bool downloadonly=false){
        auto list=GetPackageList(getUrl(), "tir");
        std::sort(list.begin(), list.end(), std::greater<std::string>());
        //1. 버전 없음   opencv
        //2. 버전 있음   opencv==3.4
        //3. 옵션 있음   opencv==3.4+cu100
        DownloadPackage inpack=LibParse(package);
        inpack.options.erase("win64");
        inpack.options.erase("linux");
        inpack.options.erase("msvc");
        inpack.options.erase("gnuc");
        inpack.options.erase("cling");
        std::string compiler_original=get_compiler();
        std::string compiler = get_compiler_for_download(compiler_original);
        if(compiler==""){
            std::cout << ispring::xout.red << "The specified compiler is not supported." << ispring::xout.white << std::endl;
            exit(1);
        }
        inpack.options.insert(compiler);
#if defined(_WIN32) || defined(_WIN64)
        inpack.options.insert("win64");
#elif defined(__linux__)
        inpack.options.insert("linux");
#endif
        bool match=false;
        std::vector<std::pair<int,DownloadPackage>> pkglist;
        for(auto e:list){
            int slash=e.find_last_of("/");
            std::string cpackage=e.substr(slash+1,e.length()-slash);
            DownloadPackage outpack=CLibParse(cpackage.substr(0,cpackage.find_last_of('.')));
            outpack.url=e;
            int diff=inpack.match(outpack);
            if(diff==-1) {
                match=true;
                Download(outpack,compiler_original,downloadonly);
                break;
            }else if(diff!=INT_MAX){
                pkglist.push_back(std::make_pair(diff,outpack));
            }
        }
        if(match==false && pkglist.empty()==false) {
            std::stable_sort(pkglist.begin(),pkglist.end(),[](const std::pair<int,DownloadPackage>& a,const std::pair<int,DownloadPackage>& b)->bool{
                return a.first < b.first;
            });
            match=true;
            Download(pkglist.front().second,compiler_original,downloadonly);
        }
        if(match==false){
            std::cout << ispring::xout.red << "ERROR: Could not find a version that satisfies the requirement " << inpack.libname << std::endl;
            std::cout << "ERROR: No matching distribution found for " << inpack.libname;
            if(inpack.version!="")
                std::cout << "==" << inpack.version ;
            std::cout << ispring::xout.white << std::endl;
        }
    }